

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::GenerateDocCommentBodyForLocation
               (Printer *printer,SourceLocation *location)

{
  pointer pcVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  pointer pcVar4;
  char *text;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string comments;
  string local_78;
  string local_50;
  
  bVar7 = (location->leading_comments)._M_string_length == 0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar2 = (&location->leading_comments)[bVar7]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,
             pcVar2 + (&location->leading_comments)[bVar7]._M_string_length);
  if (local_50._M_string_length != 0) {
    EscapePhpdoc(&local_78,&local_50);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    SplitStringUsing(&local_50,"\n",
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_78);
    _Var3._M_p = local_78._M_dataplus._M_p;
    if (local_78._M_dataplus._M_p != (pointer)local_78._M_string_length) {
      do {
        if (*(long *)(local_78._M_string_length + -0x18) != 0) break;
        pcVar2 = (pointer)(local_78._M_string_length + -0x20);
        pcVar1 = (pointer)(local_78._M_string_length + -0x20);
        pcVar4 = (pointer)(local_78._M_string_length + -0x10);
        local_78._M_string_length = (size_type)pcVar2;
        if (*(pointer *)pcVar1 != pcVar4) {
          operator_delete(*(pointer *)pcVar1,*(long *)pcVar4 + 1);
          _Var3._M_p = local_78._M_dataplus._M_p;
        }
      } while (_Var3._M_p != (pointer)local_78._M_string_length);
    }
    io::Printer::Print(printer," * <pre>\n");
    if ((pointer)local_78._M_string_length != local_78._M_dataplus._M_p) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        text = " *^line^\n";
        if ((*(long *)(local_78._M_dataplus._M_p + lVar5 + 8) != 0) &&
           (text = " * ^line^\n",
           *(((string *)(local_78._M_dataplus._M_p + lVar5))->_M_dataplus)._M_p != '/')) {
          text = " *^line^\n";
        }
        io::Printer::Print(printer,text,"line",(string *)(local_78._M_dataplus._M_p + lVar5));
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x20;
      } while (uVar6 < (ulong)((long)(local_78._M_string_length - (long)local_78._M_dataplus._M_p)
                              >> 5));
    }
    io::Printer::Print(printer," * </pre>\n *\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void GenerateDocCommentBodyForLocation(
    io::Printer* printer, const SourceLocation& location) {
  string comments = location.leading_comments.empty() ?
      location.trailing_comments : location.leading_comments;
  if (!comments.empty()) {
    // TODO(teboring):  Ideally we should parse the comment text as Markdown and
    //   write it back as HTML, but this requires a Markdown parser.  For now
    //   we just use <pre> to get fixed-width text formatting.

    // If the comment itself contains block comment start or end markers,
    // HTML-escape them so that they don't accidentally close the doc comment.
    comments = EscapePhpdoc(comments);

    vector<string> lines = Split(comments, "\n");
    while (!lines.empty() && lines.back().empty()) {
      lines.pop_back();
    }

    printer->Print(" * <pre>\n");
    for (int i = 0; i < lines.size(); i++) {
      // Most lines should start with a space.  Watch out for lines that start
      // with a /, since putting that right after the leading asterisk will
      // close the comment.
      if (!lines[i].empty() && lines[i][0] == '/') {
        printer->Print(" * ^line^\n", "line", lines[i]);
      } else {
        printer->Print(" *^line^\n", "line", lines[i]);
      }
    }
    printer->Print(
        " * </pre>\n"
        " *\n");
  }
}